

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  long lVar1;
  void *pvVar2;
  value_type pFVar3;
  bool bVar4;
  size_type sVar5;
  reference ppFVar6;
  LevelState *pLVar7;
  LevelState *this_00;
  size_type in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  uint32_t i;
  FileSet *added;
  int level;
  const_iterator it;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  Version *in_stack_ffffffffffffff68;
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff70;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffffa8;
  uint local_4c;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
    pvVar2 = *(void **)(in_RDI + 0x40 + (long)local_3c * 0x38);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffff68);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::size((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            *)in_stack_ffffffffffffff68);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffffa8,in_RDI);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::begin(in_stack_ffffffffffffff70);
    while( true ) {
      std::
      set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
      ::end(in_stack_ffffffffffffff70);
      bVar4 = std::operator==((_Self *)in_stack_ffffffffffffff78,(_Self *)in_stack_ffffffffffffff70)
      ;
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator*
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)in_stack_ffffffffffffff68);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                (in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70);
      std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>::operator++
                ((_Rb_tree_const_iterator<leveldb::FileMetaData_*> *)in_stack_ffffffffffffff68);
    }
    if (pvVar2 != (void *)0x0) {
      std::
      set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
      ::~set((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
              *)in_stack_ffffffffffffff68);
      operator_delete(pvVar2,0x30);
    }
    for (local_4c = 0;
        sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffff68), local_4c < sVar5; local_4c = local_4c + 1)
    {
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
      pFVar3 = *ppFVar6;
      pFVar3->refs = pFVar3->refs + -1;
      in_stack_ffffffffffffffa8 = pFVar3;
      if ((pFVar3->refs < 1) && (pFVar3 != (value_type)0x0)) {
        FileMetaData::~FileMetaData((FileMetaData *)in_stack_ffffffffffffff68);
        operator_delete(pFVar3,0x58);
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              (in_stack_ffffffffffffff78);
  }
  Version::Unref(in_stack_ffffffffffffff68);
  pLVar7 = (LevelState *)(in_RDI + 0x10);
  this_00 = (LevelState *)(in_RDI + 0x198);
  do {
    this_00 = this_00 + -1;
    LevelState::~LevelState(this_00);
  } while (this_00 != pLVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }